

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_restr * lys_restr_dup(lys_module *mod,lys_restr *old,int size,unres_schema *unres)

{
  uint8_t size_00;
  lys_restr *plVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    plVar1 = (lys_restr *)0x0;
  }
  else {
    plVar1 = (lys_restr *)calloc((long)size,0x38);
    if (plVar1 == (lys_restr *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      plVar1 = (lys_restr *)0x0;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_restr_dup");
    }
    else {
      uVar4 = 0;
      uVar5 = (ulong)(uint)size;
      if (size < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 * 0x38 - uVar4 != 0; uVar4 = uVar4 + 0x38) {
        size_00 = (&old->ext_size)[uVar4];
        (&plVar1->ext_size)[uVar4] = size_00;
        lys_ext_dup(mod,*(lys_ext_instance ***)((long)&old->ext + uVar4),size_00,
                    (void *)((long)&plVar1->expr + uVar4),LYEXT_PAR_RESTR,
                    (lys_ext_instance ***)((long)&plVar1->ext + uVar4),unres);
        pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->expr + uVar4),0);
        *(char **)((long)&plVar1->expr + uVar4) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->dsc + uVar4),0);
        *(char **)((long)&plVar1->dsc + uVar4) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->ref + uVar4),0);
        *(char **)((long)&plVar1->ref + uVar4) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->eapptag + uVar4),0);
        *(char **)((long)&plVar1->eapptag + uVar4) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->emsg + uVar4),0);
        *(char **)((long)&plVar1->emsg + uVar4) = pcVar2;
      }
    }
  }
  return plVar1;
}

Assistant:

static struct lys_restr *
lys_restr_dup(struct lys_module *mod, struct lys_restr *old, int size, struct unres_schema *unres)
{
    struct lys_restr *result;
    int i;

    if (!size) {
        return NULL;
    }

    result = calloc(size, sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    for (i = 0; i < size; i++) {
        result[i].ext_size = old[i].ext_size;
        lys_ext_dup(mod, old[i].ext, old[i].ext_size, &result[i], LYEXT_PAR_RESTR, &result[i].ext, unres);
        result[i].expr = lydict_insert(mod->ctx, old[i].expr, 0);
        result[i].dsc = lydict_insert(mod->ctx, old[i].dsc, 0);
        result[i].ref = lydict_insert(mod->ctx, old[i].ref, 0);
        result[i].eapptag = lydict_insert(mod->ctx, old[i].eapptag, 0);
        result[i].emsg = lydict_insert(mod->ctx, old[i].emsg, 0);
    }

    return result;
}